

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

int helicsInputGetStringSize(HelicsInput inp)

{
  int iVar1;
  HelicsInput pvVar2;
  size_t sVar3;
  
  iVar1 = 0;
  pvVar2 = (HelicsInput)0x0;
  if ((inp != (HelicsInput)0x0) && (*inp == 0x3456e052)) {
    pvVar2 = inp;
  }
  if (pvVar2 != (HelicsInput)0x0) {
    sVar3 = helics::Input::getStringSize(*(Input **)((long)pvVar2 + 0x18));
    iVar1 = (int)sVar3 + 1;
  }
  return iVar1;
}

Assistant:

int helicsInputGetStringSize(HelicsInput inp)
{
    auto* inpObj = verifyInput(inp, nullptr);
    if (inpObj == nullptr) {
        return 0;
    }
    try {
        return static_cast<int>(inpObj->inputPtr->getStringSize()) + 1;
    }
    // LCOV_EXCL_START
    catch (...) {
        return 0;
    }
    // LCOV_EXCL_STOP
}